

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_ptr.hpp
# Opt level: O3

void __thiscall
duckdb::optional_ptr<duckdb::DataChunk,_true>::CheckValid
          (optional_ptr<duckdb::DataChunk,_true> *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->ptr != (DataChunk *)0x0) {
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Attempting to dereference an optional pointer that is not set","")
  ;
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CheckValid() const {
		if (MemorySafety<SAFE>::ENABLED) {
			if (!ptr) {
				throw InternalException("Attempting to dereference an optional pointer that is not set");
			}
		}
	}